

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O3

int big_file_mpi_open(BigFile *bf,char *basename,MPI_Comm comm)

{
  int iVar1;
  char *__dest;
  size_t __n;
  int rank;
  int local_2c;
  
  if (comm == (MPI_Comm)&ompi_mpi_comm_null) {
    return 0;
  }
  MPI_Comm_rank(comm,&local_2c);
  if (local_2c == 0) {
    iVar1 = big_file_open(bf,basename);
  }
  else {
    __n = 0;
    do {
      if (basename[__n] == '\0') goto LAB_00103f2b;
      __n = __n + 1;
    } while (__n != 0x2000);
    __n = 0x2000;
LAB_00103f2b:
    __dest = (char *)malloc(__n + 1);
    strncpy(__dest,basename,__n);
    __dest[__n] = '\0';
    bf->basename = __dest;
    iVar1 = 0;
  }
  iVar1 = big_file_mpi_broadcast_anyerror(iVar1,comm);
  return iVar1;
}

Assistant:

int big_file_mpi_open(BigFile * bf, const char * basename, MPI_Comm comm) {
    if(comm == MPI_COMM_NULL) return 0;
    int rank;
    MPI_Comm_rank(comm, &rank);
    int rt = 0;
    if (rank == 0) {
        rt = big_file_open(bf, basename);
    } else {
        /* FIXME : */
        bf->basename = _strdup(basename);
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}